

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constr_base.h
# Opt level: O1

double mp::ComputeValue<mp::AlgebraicConstraint<mp::LinTerms,mp::AlgConRhs<1>>,mp::VarInfoRecomp>
                 (AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<1>_> *param_1,
                 VarInfoRecomp *param_2)

{
  Error *this;
  char **in_RCX;
  char *local_40;
  string local_38;
  
  this = (Error *)__cxa_allocate_exception(0x18);
  local_40 = "N2mp19AlgebraicConstraintINS_8LinTermsENS_9AlgConRhsILi1EEEEE";
  fmt::format<char_const*>
            (&local_38,(fmt *)"ComputeValue({}) not implemented.",(CStringRef)&local_40,in_RCX);
  Error::Error(this,(CStringRef)local_38._M_dataplus._M_p,-1);
  __cxa_throw(this,&Error::typeinfo,fmt::SystemError::~SystemError);
}

Assistant:

double ComputeValue(const Con& , const VarVec& ) {
  MP_RAISE(fmt::format("ComputeValue({}) not implemented.",
                       typeid(Con).name()));
  return 0.0;
}